

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_syms.c
# Opt level: O0

_Bool gen_iblock(int K,int T,int n_ESIs,uint32_t *ESIs)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  long in_RCX;
  uint in_EDX;
  int in_ESI;
  uint in_EDI;
  size_t out_written;
  int RUN_NOFAIL__err_4;
  size_t outdata_sz;
  size_t ret;
  size_t indata_sz;
  int RUN_NOFAIL__err_3;
  int RUN_NOFAIL__err_2;
  int i;
  int RUN_NOFAIL__err_1;
  int RUN_NOFAIL__err;
  size_t inter_sym_num;
  size_t prog_sz;
  size_t work_sz;
  int nExtra;
  void *outdata;
  void *indata;
  RqInterProgram *prog;
  RqInterWorkMem *wrk;
  _Bool success;
  int local_6c;
  long local_60;
  size_t local_58;
  size_t local_50;
  int local_44;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  byte local_19;
  long local_18;
  uint local_c;
  int local_8;
  uint local_4;
  
  local_19 = 0;
  local_28 = (void *)0x0;
  local_30 = (void *)0x0;
  local_38 = (void *)0x0;
  local_40 = (void *)0x0;
  if ((int)in_EDX < (int)in_EDI) {
    fprintf(_stderr,"Error:  Insufficient number of Symbols.\n        K=%d, #ESIs=%d\n",
            (ulong)in_EDI,(ulong)in_EDX);
  }
  else {
    local_44 = in_EDX - in_EDI;
    local_18 = in_RCX;
    local_c = in_EDX;
    local_8 = in_ESI;
    local_4 = in_EDI;
    uVar1 = RqInterGetMemSizes(in_EDI,local_44,&local_50,&local_58,&local_60);
    if (uVar1 == 0) {
      local_28 = malloc(local_50);
      local_30 = malloc(local_58);
      uVar1 = RqInterInit(local_4,local_44,local_28,local_50);
      if (uVar1 == 0) {
        for (local_6c = 0; local_6c < (int)local_c; local_6c = local_6c + 1) {
          uVar1 = RqInterAddIds(local_28,*(undefined4 *)(local_18 + (long)local_6c * 4),1);
          if (uVar1 != 0) {
            fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                    ,0x4f,"RqInterAddIds(wrk, ESIs[i], 1)",(ulong)uVar1);
            goto LAB_00101678;
          }
        }
        uVar1 = RqInterCompile(local_28,local_30,local_58);
        if (uVar1 == 0) {
          sVar2 = (long)local_8 * (long)(int)local_c;
          local_38 = malloc(sVar2);
          sVar3 = fread(local_38,1,sVar2,_stdin);
          if (sVar3 == sVar2) {
            sVar3 = local_60 * local_8;
            local_40 = malloc(sVar3);
            uVar1 = RqInterExecute(local_30,(long)local_8,local_38,sVar2,local_40,sVar3);
            if (uVar1 == 0) {
              sVar2 = fwrite(local_40,1,sVar3,_stdout);
              if (sVar2 == sVar3) {
                local_19 = 1;
              }
              else {
                fprintf(_stderr,"Error:  fwrite() returned a short count.\n");
              }
            }
            else {
              fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                      ,0x5e,"RqInterExecute(prog, T, indata, indata_sz, outdata, outdata_sz)",
                      (ulong)uVar1);
            }
          }
          else {
            fprintf(_stderr,"Error:  fread() returned a short count.\n");
          }
        }
        else {
          fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                  ,0x50,"RqInterCompile(wrk, prog, prog_sz)",(ulong)uVar1);
        }
      }
      else {
        fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                ,0x4d,"RqInterInit(K, nExtra, wrk, work_sz)",(ulong)uVar1);
      }
    }
    else {
      fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
              ,0x49,"RqInterGetMemSizes(K, nExtra, &work_sz, &prog_sz, &inter_sym_num)",(ulong)uVar1
             );
    }
  }
LAB_00101678:
  if (local_40 != (void *)0x0) {
    free(local_40);
  }
  if (local_38 != (void *)0x0) {
    free(local_38);
  }
  if (local_30 != (void *)0x0) {
    free(local_30);
  }
  if (local_28 != (void *)0x0) {
    free(local_28);
  }
  return (_Bool)(local_19 & 1);
}

Assistant:

bool gen_iblock(int K, int T, int n_ESIs, uint32_t* ESIs)
{
	bool success = false;

	RqInterWorkMem* wrk = NULL;
	RqInterProgram* prog = NULL;
	void* indata = NULL;
	void* outdata = NULL;

	if (n_ESIs < K) {
		fprintf(stderr, "Error:  Insufficient number of Symbols.\n"
		                "        K=%d, #ESIs=%d\n", K, n_ESIs);
		goto xit;
	}

	int nExtra = n_ESIs - K;
	size_t work_sz, prog_sz, inter_sym_num;
	RUN_NOFAIL(RqInterGetMemSizes(K,
				nExtra,
				&work_sz,
				&prog_sz,
				&inter_sym_num), xit);
	wrk = malloc(work_sz);
	prog = malloc(prog_sz);

	RUN_NOFAIL(RqInterInit(K, nExtra, wrk, work_sz), xit);
	for (int i = 0; i < n_ESIs; ++i)
		RUN_NOFAIL(RqInterAddIds(wrk, ESIs[i], 1), xit);
	RUN_NOFAIL(RqInterCompile(wrk, prog, prog_sz), xit);

	/* Read source data */
	size_t indata_sz = T * (size_t)n_ESIs;
	indata = malloc(indata_sz);
	size_t ret = fread(indata, 1, indata_sz, stdin);
	if (ret != indata_sz) {
		fprintf(stderr, "Error:  fread() returned a short count.\n");
		goto xit;
	}

	/* Generate iblock data */
	size_t outdata_sz = inter_sym_num * T;
	outdata = malloc(outdata_sz);
	RUN_NOFAIL(RqInterExecute(prog, T, indata, indata_sz, outdata, outdata_sz), xit);

	/* Print them to stdout */
	size_t out_written = fwrite(outdata, 1, outdata_sz, stdout);
	if (out_written != outdata_sz) {
		fprintf(stderr, "Error:  fwrite() returned a short count.\n");
		goto xit;
	}

	/* Done */
	success = true;
xit:
	if (outdata)		free(outdata);
	if (indata)		free(indata);
	if (prog)		free(prog);
	if (wrk)		free(wrk);
	return success;
}